

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::goToDirectory(QFileDialogPrivate *this,QString *path)

{
  QWidget *this_00;
  QFileSystemModel *pQVar1;
  QAbstractProxyModel *pQVar2;
  bool bVar3;
  QArrayData *pQVar4;
  QAbstractItemModel *pQVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  QFileDialogPrivate *pQVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QAnyStringView QVar14;
  QStringView QVar15;
  QDir dir;
  QArrayData *local_110 [3];
  QString local_f8;
  undefined1 *local_e0;
  QString local_d8;
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  QAbstractItemModel *local_a8;
  undefined1 local_98 [16];
  QAbstractItemModel *local_88;
  QArrayData *local_78;
  char16_t *pcStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_70 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar12 = (QFileDialogPrivate *)
            QComboBox::model(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  iVar10 = QComboBox::currentIndex(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  iVar11 = QComboBox::modelColumn(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  QComboBox::rootModelIndex
            ((QModelIndex *)&local_58,&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  (**(code **)(*(long *)&(pQVar12->super_QDialogPrivate).super_QWidgetPrivate + 0x60))
            (&local_78,pQVar12,iVar10,iVar11,&local_58);
  local_98._0_8_ = (path->d).d;
  local_98._8_8_ = (path->d).ptr;
  local_88 = (QAbstractItemModel *)(path->d).size;
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_98._0_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_98._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((((int)local_78 < 0) || ((long)local_78 < 0)) || (local_68.ptr == (QAbstractItemModel *)0x0))
  {
    pQVar1 = this->model;
    getEnvironmentVariable(&local_d8,pQVar12,path);
    QFileSystemModel::index((QString *)&local_b8,(int)pQVar1);
    pQVar2 = this->proxyModel;
    if (pQVar2 == (QAbstractProxyModel *)0x0) {
      local_58._16_8_ = local_a8;
      local_58.shared = (PrivateShared *)local_b8;
      local_58._8_8_ = pcStack_b0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x198))(&local_58,pQVar2,&local_b8);
    }
    local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_78 = (QArrayData *)local_58.shared;
    pcStack_70 = (char16_t *)local_58._8_8_;
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (local_68.ptr == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (char16_t *)0x0;
      local_58._16_8_ = 0;
      local_40 = 2;
    }
    else {
      (**(code **)(*(long *)local_68.ptr + 0x90))(&local_58,local_68.ptr,&local_78,0x101);
    }
    ::QVariant::toUrl();
    QUrl::toLocalFile();
    uVar7 = local_98._8_8_;
    uVar6 = local_98._0_8_;
    pQVar5 = local_a8;
    pQVar4 = local_b8;
    local_b8 = (QArrayData *)local_98._0_8_;
    local_98._0_8_ = pQVar4;
    local_98._8_8_ = pcStack_b0;
    pcStack_b0 = (char16_t *)uVar7;
    local_a8 = local_88;
    local_88 = pQVar5;
    if ((QArrayData *)uVar6 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar6)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar6,2,0x10);
      }
    }
    QUrl::~QUrl((QUrl *)&local_d8);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileSystemModel::index((QString *)&local_b8,(int)this->model);
    pQVar2 = this->proxyModel;
    if (pQVar2 == (QAbstractProxyModel *)0x0) {
      local_58._16_8_ = local_a8;
      local_58.shared = (PrivateShared *)local_b8;
      local_58._8_8_ = pcStack_b0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x198))(&local_58,pQVar2,&local_b8);
    }
    local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_78 = (QArrayData *)local_58.shared;
    pcStack_70 = (char16_t *)local_58._8_8_;
  }
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar12 = (QFileDialogPrivate *)local_98;
  QDir::QDir((QDir *)&local_e0,(QString *)pQVar12);
  cVar8 = QDir::exists();
  if (cVar8 == '\0') {
    getEnvironmentVariable((QString *)&local_58,pQVar12,(QString *)local_98);
    QDir::setPath((QString *)&local_e0);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
  }
  cVar8 = QDir::exists();
  cVar9 = '\x01';
  if ((cVar8 == '\0') && (local_88 != (QAbstractItemModel *)0x0)) {
    cVar9 = '\0';
    QFileSystemModel::myComputer((int)&local_58);
    ::QVariant::toString();
    bVar3 = true;
    if (local_88 == local_a8) {
      QVar13.m_data = (storage_type_conflict *)local_98._8_8_;
      QVar13.m_size = (qsizetype)local_88;
      QVar15.m_data = pcStack_b0;
      QVar15.m_size = (qsizetype)local_a8;
      cVar9 = QtPrivate::equalStrings(QVar13,QVar15);
    }
  }
  else {
    bVar3 = false;
  }
  if (bVar3) {
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (cVar9 == '\0') {
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QMetaObject::tr((char *)&local_d8,(char *)&QFileDialog::staticMetaObject,0x6f4add);
    QWidget::windowTitle(&local_f8,this_00);
    QVar14.m_size = (size_t)&local_d8;
    QVar14.field_0.m_data = local_110;
    QString::arg_impl(QVar14,(int)local_98._8_8_,(QChar)(char16_t)local_88);
    QMessageBox::warning(this_00,&local_f8,(QString *)local_110,(StandardButtons)0x400,NoButton);
    if (local_110[0] != (QArrayData *)0x0) {
      LOCK();
      (local_110[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_110[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_110[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_110[0],2,0x10);
      }
    }
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    enterDirectory(this,(QModelIndex *)&local_78);
  }
  QDir::~QDir((QDir *)&local_e0);
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::goToDirectory(const QString &path)
{
    enum { UrlRole = Qt::UserRole + 1 };

 #if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
#endif
    QModelIndex index = qFileDialogUi->lookInCombo->model()->index(qFileDialogUi->lookInCombo->currentIndex(),
                                                    qFileDialogUi->lookInCombo->modelColumn(),
                                                    qFileDialogUi->lookInCombo->rootModelIndex());
    QString path2 = path;
    if (!index.isValid())
        index = mapFromSource(model->index(getEnvironmentVariable(path)));
    else {
        path2 = index.data(UrlRole).toUrl().toLocalFile();
        index = mapFromSource(model->index(path2));
    }
    QDir dir(path2);
    if (!dir.exists())
        dir.setPath(getEnvironmentVariable(path2));

    if (dir.exists() || path2.isEmpty() || path2 == model->myComputer().toString()) {
        enterDirectory(index);
#if QT_CONFIG(messagebox)
    } else {
        QString message = QFileDialog::tr("%1\nDirectory not found.\nPlease verify the "
                                          "correct directory name was given.");
        QMessageBox::warning(q, q->windowTitle(), message.arg(path2));
#endif // QT_CONFIG(messagebox)
    }
}